

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

int __thiscall
Function::clone(Function *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Function *this_00;
  shared_ptr<BlockNode> local_78;
  Context local_68;
  
  Context::clone(&local_68,__fn + 0x38,__child_stack,__flags,__arg);
  this_00 = (Function *)operator_new(0x88);
  local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(__fn + 0x28);
  local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__fn + 0x30);
  if (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  Function(this_00,(TypeName *)(__fn + 0xc),(ArgumentsList *)(__fn + 0x10),&local_78,&local_68);
  if (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  (this->super_Value)._vptr_Value = (_func_int **)this_00;
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque(&local_68.scopes_);
  return (int)this;
}

Assistant:

std::unique_ptr<Value> Function::clone() const
{
  return std::make_unique<Function>(returnType_, arguments_, body_, context_.clone());
}